

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small_operators.h
# Opt level: O0

Element_conflict __thiscall
Gudhi::persistence_fields::Multi_field_operators_with_small_characteristics::
get_partial_multiplicative_identity
          (Multi_field_operators_with_small_characteristics *this,
          Characteristic *productOfCharacteristics)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint local_28;
  Element_conflict local_24;
  uint idx;
  Element_conflict multIdentity;
  Characteristic *productOfCharacteristics_local;
  Multi_field_operators_with_small_characteristics *this_local;
  
  if (*productOfCharacteristics == 0) {
    this_local._4_4_ = get_multiplicative_identity();
  }
  else {
    local_24 = 0;
    local_28 = 0;
    while( true ) {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->primes_);
      if (sVar2 <= local_28) break;
      uVar1 = *productOfCharacteristics;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->primes_,(ulong)local_28);
      if (uVar1 % *pvVar3 == 0) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->partials_,(ulong)local_28);
        local_24 = _add(local_24,*pvVar3,this->productOfAllCharacteristics_);
      }
      local_28 = local_28 + 1;
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

Element get_partial_multiplicative_identity(const Characteristic& productOfCharacteristics) const {
    if (productOfCharacteristics == 0) {
      return get_multiplicative_identity();
    }
    Element multIdentity = 0;
    for (unsigned int idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        multIdentity = _add(multIdentity, partials_[idx], productOfAllCharacteristics_);
      }
    }
    return multIdentity;
  }